

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

void __thiscall xray_re::xr_mesh_builder::remove_empty_surfmaps(xr_mesh_builder *this)

{
  pointer ppxVar1;
  xr_surfmap *pxVar2;
  xr_surfmap_vec_it it;
  pointer ppxVar3;
  const_iterator __first;
  
  ppxVar1 = (this->super_xr_mesh).m_surfmaps.
            super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppxVar3 = (this->super_xr_mesh).m_surfmaps.
            super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __first._M_current = ppxVar3;
  for (; ppxVar3 != ppxVar1; ppxVar3 = ppxVar3 + 1) {
    pxVar2 = *ppxVar3;
    if ((pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&(pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      operator_delete(pxVar2,0x20);
    }
    else {
      if (ppxVar3 != __first._M_current) {
        *__first._M_current = pxVar2;
      }
      __first._M_current = __first._M_current + 1;
    }
  }
  std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::erase
            (&(this->super_xr_mesh).m_surfmaps,__first,
             (const_iterator)
             (this->super_xr_mesh).m_surfmaps.
             super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void xr_mesh_builder::remove_empty_surfmaps()
{
	xr_surfmap_vec_it last = m_surfmaps.begin();
	for (xr_surfmap_vec_it it = last, end = m_surfmaps.end(); it != end; ++it) {
		xr_surfmap* smap = *it;
		if (smap->faces.empty()) {
			delete smap;
			continue;
		}
		if (it != last)
			*last = smap;
		++last;
	}
	m_surfmaps.erase(last, m_surfmaps.end());
}